

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall Instance::computeConstraints(Instance *this)

{
  pointer pTVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  Train *train;
  pointer train_00;
  
  pTVar1 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (train_00 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
                  super__Vector_impl_data._M_start; train_00 != pTVar1; train_00 = train_00 + 1) {
    computeReachableConstraint(this,train_00);
    computeCollisionConstraint(this,train_00);
    ppEVar2 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppEVar3 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppEVar3 != ppEVar2; ppEVar3 = ppEVar3 + 1) {
      computeVssConstraint(this,train_00,*ppEVar3);
    }
    computeLengthConstraint(this,train_00);
  }
  return;
}

Assistant:

void Instance::computeConstraints() {
  // these constraints always have to hold no matter the task
  for (Train &train : trains) {

    computeReachableConstraint(train);

    computeCollisionConstraint(train);
    for (Edge *edge : graph.edges) {
      computeVssConstraint(train, edge);
    }

    computeLengthConstraint(train);
  }
}